

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O0

void ncnn::convdw3x3s1_int8_requant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_requant,Option *opt)

{
  reference pvVar1;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  vector<float,_std::allocator<float>_> *in_R8;
  double dVar2;
  int sum;
  int remain;
  int i;
  char *r2;
  char *r1;
  char *r0;
  char *img0;
  char *kernel0;
  float scale_requant_out;
  float scale_requant_in;
  float bias0;
  char *outptr;
  Mat out;
  int p;
  float *bias;
  char *kernel;
  int outch;
  int outh;
  int outw;
  int w;
  Mat *m;
  int int32;
  Mat *m_1;
  float local_31c;
  int local_2e8;
  int local_2e4;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined4 local_2b0;
  long local_2a8;
  undefined4 local_2a0;
  undefined4 local_29c;
  undefined4 local_298;
  undefined4 local_294;
  undefined4 local_290;
  undefined8 local_288;
  char *local_280;
  char *local_278;
  value_type local_270;
  value_type local_26c;
  float local_268;
  undefined1 *local_258;
  undefined1 *local_250;
  int *local_248;
  ulong local_240;
  undefined4 local_238;
  long *local_230;
  int local_228;
  int local_224;
  int local_220;
  undefined4 local_21c;
  undefined4 local_218;
  ulong local_210;
  int local_204;
  long local_200;
  long local_1f8;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  long *local_1c0;
  long *local_1b8;
  undefined8 *local_1b0;
  undefined1 **local_1a0;
  int local_180;
  undefined4 local_17c;
  undefined1 **local_178;
  undefined8 *local_158;
  undefined1 local_14d;
  int local_14c;
  undefined1 **local_140;
  undefined1 **local_118;
  undefined8 *local_110;
  int local_fc;
  float local_f8;
  undefined1 local_f1;
  undefined1 *local_d8;
  undefined1 local_c5;
  int local_c4;
  undefined8 *local_b8;
  long local_90;
  undefined4 local_84;
  long local_80;
  char *local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  long *local_58;
  undefined4 local_4c;
  ulong local_48;
  undefined1 *local_40;
  undefined4 local_34;
  int local_30;
  int local_2c;
  undefined1 **local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_1e4 = *(int *)((long)in_RDI + 0x2c);
  local_1e8 = *(int *)((long)in_RSI + 0x2c);
  local_1ec = (int)in_RSI[6];
  local_1f0 = (int)in_RSI[7];
  local_1f8 = *in_RDX;
  local_200 = *in_RCX;
  local_1c0 = in_RSI;
  local_1b8 = in_RDI;
  for (local_204 = 0; local_204 < local_1f0; local_204 = local_204 + 1) {
    local_140 = &local_250;
    local_2c = *(int *)((long)local_1c0 + 0x2c);
    local_30 = (int)local_1c0[6];
    local_34 = *(undefined4 *)((long)local_1c0 + 0x34);
    local_258 = (undefined1 *)(*local_1c0 + local_1c0[8] * (long)local_204 * local_1c0[2]);
    local_48 = local_1c0[2];
    local_4c = (undefined4)local_1c0[3];
    local_58 = (long *)local_1c0[4];
    local_28 = &local_250;
    local_248 = (int *)0x0;
    local_21c = 1;
    local_18 = (long)local_2c * (long)local_30 * local_48;
    local_210 = (local_18 + 0xfU & 0xfffffffffffffff0) / local_48;
    local_228 = (int)local_1c0[5] + -1;
    if ((int)local_1c0[5] == 4) {
      local_210 = (long)*(int *)((long)local_1c0 + 0x2c) * (long)(int)local_1c0[6];
    }
    local_1c = 0x10;
    local_14c = local_204;
    local_14d = 1;
    local_118 = &local_250;
    if (local_200 == 0) {
      local_31c = 0.0;
    }
    else {
      local_31c = *(float *)(local_200 + (long)local_204 * 4);
    }
    local_268 = local_31c;
    local_40 = local_258;
    local_250 = local_258;
    local_240 = local_48;
    local_238 = local_4c;
    local_230 = local_58;
    local_224 = local_2c;
    local_220 = local_30;
    local_218 = local_34;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in_R8,(long)(local_204 << 1));
    local_26c = *pvVar1;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in_R8,(long)(local_204 * 2 + 1))
    ;
    local_270 = *pvVar1;
    local_278 = (char *)(local_1f8 + local_204 * 9);
    local_b8 = &local_2c8;
    local_64 = *(int *)((long)local_1b8 + 0x2c);
    local_68 = (int)local_1b8[6];
    local_6c = *(undefined4 *)((long)local_1b8 + 0x34);
    local_2d0 = (char *)(*local_1b8 + local_1b8[8] * (long)local_204 * local_1b8[2]);
    local_80 = local_1b8[2];
    local_84 = (undefined4)local_1b8[3];
    local_90 = local_1b8[4];
    local_60 = &local_2c8;
    local_8 = (long)local_64 * (long)local_68 * local_80;
    local_110 = &local_2c8;
    local_1b0 = &local_2c8;
    local_c = 0x10;
    local_c4 = local_204;
    local_c5 = 1;
    local_2c8 = 0;
    local_2b8 = 0;
    local_2b0 = 0;
    local_2a0 = 0;
    local_29c = 0;
    local_298 = 0;
    local_294 = 0;
    local_290 = 0;
    local_288 = 0;
    local_2c0 = 0;
    local_2d8 = local_2d0 + local_1e4;
    local_2e0 = local_2d0 + (local_1e4 << 1);
    local_280 = local_2d0;
    local_158 = local_1b0;
    local_78 = local_2d0;
    local_2a8 = local_90;
    for (local_2e4 = 0; local_2e4 < local_1ec; local_2e4 = local_2e4 + 1) {
      for (local_2e8 = local_1e8; 0 < local_2e8; local_2e8 = local_2e8 + -1) {
        local_f8 = ((float)((int)local_2e0[2] * (int)local_278[8] +
                           (int)local_2e0[1] * (int)local_278[7] +
                           (int)*local_2e0 * (int)local_278[6] +
                           (int)local_2d8[2] * (int)local_278[5] +
                           (int)local_2d8[1] * (int)local_278[4] +
                           (int)*local_2d8 * (int)local_278[3] +
                           (int)local_2d0[2] * (int)local_278[2] +
                           (int)local_2d0[1] * (int)local_278[1] + (int)*local_2d0 * (int)*local_278
                           ) * local_26c + local_268) * local_270;
        dVar2 = std::round((double)(ulong)(uint)local_f8);
        local_fc = (int)SUB84(dVar2,0);
        if (local_fc < 0x80) {
          if (local_fc < -0x7f) {
            local_f1 = 0x81;
          }
          else {
            local_f1 = (undefined1)local_fc;
          }
        }
        else {
          local_f1 = 0x7f;
        }
        *local_258 = local_f1;
        local_2d0 = local_2d0 + 1;
        local_2d8 = local_2d8 + 1;
        local_2e0 = local_2e0 + 1;
        local_258 = local_258 + 1;
      }
      local_2d0 = local_2d0 + 2;
      local_2d8 = local_2d8 + 2;
      local_2e0 = local_2e0 + 2;
    }
    local_1a0 = &local_250;
    local_178 = local_1a0;
    if (local_248 != (int *)0x0) {
      local_17c = 0xffffffff;
      LOCK();
      local_180 = *local_248;
      *local_248 = *local_248 + -1;
      UNLOCK();
      if (local_180 == 1) {
        if (local_230 == (long *)0x0) {
          local_d8 = local_250;
          if (local_250 != (undefined1 *)0x0) {
            free(local_250);
          }
        }
        else {
          (**(code **)(*local_230 + 0x18))(local_230,local_250);
        }
      }
    }
  }
  return;
}

Assistant:

static void convdw3x3s1_int8_requant_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, std::vector<float> scales_requant, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        signed char* outptr = out;

        const float bias0 = bias ? bias[p] : 0.f;
        const float scale_requant_in = scales_requant[2 * p];
        const float scale_requant_out = scales_requant[2 * p + 1];

        const signed char* kernel0 = (const signed char*)kernel + p * 9;

        const signed char* img0 = bottom_blob.channel(p);
        const signed char* r0 = img0;
        const signed char* r1 = img0 + w;
        const signed char* r2 = img0 + w * 2;

        int i = 0;
        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr = float2int8(((float)sum * scale_requant_in + bias0) * scale_requant_out);

                r0++;
                r1++;
                r2++;
                outptr++;
            }

            r0 += 2;
            r1 += 2;
            r2 += 2;
        }
    }
}